

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O3

bool __thiscall pbrt::TransformedPrimitive::IntersectP(TransformedPrimitive *this,Ray *r,Float tMax)

{
  float fVar1;
  undefined8 uVar2;
  Transform *this_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  undefined1 auVar6 [16];
  Interval<float> i;
  Interval<float> i_00;
  Interval<float> i_01;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  Point3fi local_c8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  Ray local_50;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  fVar16 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar7._4_4_ = fVar16;
  auVar7._0_4_ = fVar16;
  auVar7._8_4_ = fVar16;
  auVar7._12_4_ = fVar16;
  fVar16 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar6._4_4_ = fVar16;
  auVar6._0_4_ = fVar16;
  auVar6._8_4_ = fVar16;
  auVar6._12_4_ = fVar16;
  fVar16 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar13._4_4_ = fVar16;
  auVar13._0_4_ = fVar16;
  auVar13._8_4_ = fVar16;
  auVar13._12_4_ = fVar16;
  this_00 = *(Transform **)(this + 8);
  auVar7 = vmovlhps_avx(auVar7,auVar6);
  local_50.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar7._0_8_;
  local_50.o.super_Tuple3<pbrt::Point3,_float>.z = auVar7._8_4_;
  local_50.d.super_Tuple3<pbrt::Vector3,_float>.x = auVar7._12_4_;
  uVar2 = vmovlps_avx(auVar13);
  local_50.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar2;
  local_50.d.super_Tuple3<pbrt::Vector3,_float>.z = (float)((ulong)uVar2 >> 0x20);
  Transform::ApplyInverse(&local_c8,this_00,(Point3fi *)&local_50);
  fVar16 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar1 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar12 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * (this_00->mInv).m[1][1])),ZEXT416((uint)fVar1),
                           ZEXT416((uint)(this_00->mInv).m[1][0]));
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * (this_00->mInv).m[0][1])),ZEXT416((uint)fVar1),
                           ZEXT416((uint)(this_00->mInv).m[0][0]));
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * (this_00->mInv).m[2][1])),ZEXT416((uint)fVar1),
                            ZEXT416((uint)(this_00->mInv).m[2][0]));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar12),ZEXT416((uint)(this_00->mInv).m[1][2]));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar12),ZEXT416((uint)(this_00->mInv).m[0][2]));
  auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar12),ZEXT416((uint)(this_00->mInv).m[2][2]));
  fVar16 = auVar7._0_4_;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * fVar16)),auVar6,auVar6);
  auVar8 = vfmadd231ss_fma(auVar8,auVar13,auVar13);
  if (auVar8._0_4_ <= 0.0) {
    auVar8._4_4_ = local_c8.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
    auVar8._0_4_ = local_c8.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
    auVar8._8_8_ = 0;
  }
  else {
    auVar15._8_4_ = 0x7fffffff;
    auVar15._0_8_ = 0x7fffffff7fffffff;
    auVar15._12_4_ = 0x7fffffff;
    auVar3 = vandps_avx(auVar7,auVar15);
    auVar4 = vandps_avx(auVar6,auVar15);
    auVar15 = vandps_avx(auVar13,auVar15);
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(auVar3._0_4_ *
                                           (local_c8.super_Point3<pbrt::Interval<float>_>.
                                            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
                                            high - local_c8.super_Point3<pbrt::Interval<float>_>.
                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low) * 0.5)),
                             ZEXT416((uint)((local_c8.super_Point3<pbrt::Interval<float>_>.
                                             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.
                                             high - local_c8.super_Point3<pbrt::Interval<float>_>.
                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.low) * 0.5)),auVar4);
    auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)((local_c8.super_Point3<pbrt::Interval<float>_>.
                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .z.high - local_c8.
                                                  super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .z.low) * 0.5)),auVar15);
    fVar12 = auVar3._0_4_ / auVar8._0_4_;
    fVar1 = auVar6._0_4_ * fVar12;
    i.high = fVar1;
    i.low = fVar1;
    local_a8 = ZEXT416((uint)(fVar16 * fVar12));
    local_98 = ZEXT416((uint)(auVar13._0_4_ * fVar12));
    local_88 = auVar7;
    local_78 = auVar6;
    local_68 = auVar13;
    auVar9._0_8_ = Interval<float>::operator+<float>((Interval<float> *)&local_c8,i);
    auVar9._8_56_ = extraout_var;
    uVar2 = vmovlps_avx(auVar9._0_16_);
    local_c8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .x.low = (float)uVar2;
    local_c8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .x.high = (float)((ulong)uVar2 >> 0x20);
    i_00.high = (float)local_a8._0_4_;
    i_00.low = (float)local_a8._0_4_;
    auVar10._0_8_ =
         Interval<float>::operator+<float>
                   (&local_c8.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y,i_00);
    auVar10._8_56_ = extraout_var_00;
    uVar2 = vmovlps_avx(auVar10._0_16_);
    local_c8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .y.low = (float)uVar2;
    local_c8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .y.high = (float)((ulong)uVar2 >> 0x20);
    i_01.high = (float)local_98._0_4_;
    i_01.low = (float)local_98._0_4_;
    auVar11._0_8_ =
         Interval<float>::operator+<float>
                   (&local_c8.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z,i_01);
    auVar11._8_56_ = extraout_var_01;
    auVar8 = auVar11._0_16_;
    tMax = tMax - fVar12;
    auVar6 = local_78;
    auVar7 = local_88;
    auVar13 = local_68;
  }
  auVar4._4_4_ = local_c8.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar4._0_4_ = local_c8.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar4._8_4_ = local_c8.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar4._12_4_ =
       local_c8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  auVar8 = vhaddps_avx(auVar8,auVar8);
  local_50.o.super_Tuple3<pbrt::Point3,_float>.z = auVar8._0_4_ * 0.5;
  local_50.time = r->time;
  local_50.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(r->medium).
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  auVar7 = vinsertps_avx(auVar6,auVar7,0x10);
  auVar6 = vinsertps_avx(auVar4,ZEXT416((uint)local_c8.super_Point3<pbrt::Interval<float>_>.
                                              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
                                              high),0x10);
  auVar14._0_4_ =
       local_c8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar6._0_4_;
  auVar14._4_4_ =
       local_c8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar6._4_4_;
  auVar14._8_4_ = auVar6._8_4_ + 0.0;
  auVar14._12_4_ = auVar6._12_4_ + 0.0;
  auVar3._8_4_ = 0x3f000000;
  auVar3._0_8_ = 0x3f0000003f000000;
  auVar3._12_4_ = 0x3f000000;
  auVar6 = vmulps_avx512vl(auVar14,auVar3);
  local_50.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar6);
  uVar2 = vmovlps_avx(auVar7);
  local_50.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar2;
  local_50.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar2 >> 0x20);
  local_50.d.super_Tuple3<pbrt::Vector3,_float>.z = auVar13._0_4_;
  bVar5 = PrimitiveHandle::IntersectP((PrimitiveHandle *)this,&local_50,tMax);
  return bVar5;
}

Assistant:

bool TransformedPrimitive::IntersectP(const Ray &r, Float tMax) const {
    Ray ray = renderFromPrimitive->ApplyInverse(r, &tMax);
    return primitive.IntersectP(ray, tMax);
}